

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase903::run(TestCase903 *this)

{
  bool bVar1;
  __pid_t _Var2;
  AsyncIoProvider *pAVar3;
  AsyncIoStream *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String local_1c8;
  bool local_1a9;
  undefined1 local_1a8 [7];
  bool _kj_shouldLog_1;
  char (*local_190) [4];
  undefined1 local_188 [8];
  DebugComparison<const_char_(&)[4],_kj::String> _kjCondition_1;
  SourceLocation local_148;
  Promise<unsigned_long> local_130;
  unsigned_long local_128;
  uint local_120;
  bool local_11a;
  undefined1 auStack_118 [6];
  bool _kj_shouldLog;
  Promise<unsigned_long> local_100;
  unsigned_long local_f8;
  uint local_f0;
  DebugExpression<unsigned_int> local_ec;
  undefined1 local_e8 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  SourceLocation local_b8;
  ArrayPtr<const_unsigned_char> local_a0;
  Promise<void> local_90;
  char local_88 [7];
  Type local_81;
  char buf [4];
  undefined1 local_60 [8];
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  TestCase903 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::
  Function<kj::(anonymous_namespace)::TestCase903::run()::__0>
            ((Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)> *)buf,&local_81
            );
  (*pAVar3->_vptr_AsyncIoProvider[4])(local_60,pAVar3,buf);
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::~Function
            ((Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *)buf);
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  pAVar4 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&pipeThread.thread.ptr);
  local_a0 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_114__>();
  (**(pAVar4->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_90,&pAVar4->super_AsyncOutputStream,local_a0.ptr,local_a0.size_);
  pAVar3 = ioContext.provider.ptr;
  SourceLocation::SourceLocation
            (&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x396,3);
  Promise<void>::wait(&local_90,pAVar3);
  Promise<void>::~Promise(&local_90);
  local_f0 = 3;
  local_ec = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
  pAVar4 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&pipeThread.thread.ptr);
  (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_100,pAVar4,local_88,3,4);
  pAVar3 = ioContext.provider.ptr;
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_118,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x397,0x4e);
  _Var2 = Promise<unsigned_long>::wait(&local_100,pAVar3);
  local_f8 = CONCAT44(extraout_var,_Var2);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_e8,&local_ec,&local_f8);
  Promise<unsigned_long>::~Promise(&local_100);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
  if (!bVar1) {
    local_11a = kj::_::Debug::shouldLog(ERROR);
    while (local_11a != false) {
      local_120 = 3;
      pAVar4 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                         ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&pipeThread.thread.ptr);
      (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_130,pAVar4,local_88,3,4);
      pAVar3 = ioContext.provider.ptr;
      SourceLocation::SourceLocation
                (&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,"run",0x397,0x4e);
      _Var2 = Promise<unsigned_long>::wait(&local_130,pAVar3);
      local_128 = CONCAT44(extraout_var_00,_Var2);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x397,ERROR,
                 "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", _kjCondition, 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
                 ,(char (*) [89])
                  "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
                 ,(DebugComparison<unsigned_int,_unsigned_long> *)local_e8,&local_120,&local_128);
      Promise<unsigned_long>::~Promise(&local_130);
      local_11a = false;
    }
  }
  local_190 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  heapString((String *)local_1a8,local_88,3);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_188,
             (DebugExpression<char_const(&)[4]> *)&local_190,(String *)local_1a8);
  String::~String((String *)local_1a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_1a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      heapString(&local_1c8,local_88,3);
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x398,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", _kjCondition, \"foo\", heapString(buf, 3)"
                 ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
                 (DebugComparison<const_char_(&)[4],_kj::String> *)local_188,(char (*) [4])0x9422c6,
                 &local_1c8);
      String::~String(&local_1c8);
      local_1a9 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[4],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_188);
  AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipeThread.pipe.ptr);
  return;
}

Assistant:

TEST(AsyncIo, PipeThread) {
  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4]{};
    stream.write("foo"_kjb).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));

    // Expect disconnect.
    EXPECT_EQ(0, stream.tryRead(buf, 1, 1).wait(waitScope));
  });

  char buf[4]{};
  pipeThread.pipe->write("bar"_kjb).wait(ioContext.waitScope);
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));
}